

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O0

void __thiscall
mp::pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::
ModelValues(ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>
            *this,ParamType prm,string *nm)

{
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff38;
  string *s;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *in_stack_ffffffffffffff40;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *pVVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  __lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  pVVar1 = (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *)(__lhs + 1);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::ValueMap
            (pVVar1,(BasicValuePresolver *)__lhs);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::ValueMap
            (pVVar1,(BasicValuePresolver *)__lhs);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::ValueMap
            (pVVar1,(BasicValuePresolver *)__lhs);
  ((EnvKeeper *)&in_RDI[9]._M_string_length)->env_ = (Env *)0x0;
  std::operator+(__lhs,(char *)in_RDI);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::SetName
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_48);
  pVVar1 = (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *)
           ((long)&in_RDI[3].field_2 + 8);
  std::operator+(__lhs,(char *)in_RDI);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::SetName
            (pVVar1,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_68);
  s = (string *)&in_RDI[6].field_2;
  std::operator+(__lhs,(char *)in_RDI);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::SetName(pVVar1,s);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

ModelValues(ParamType prm, const std::string& nm) :
      name_{nm}, vars_(prm), cons_(prm), objs_(prm) {
    vars_.SetName(nm+"_vars");
    cons_.SetName(nm+"_cons");
    objs_.SetName(nm+"_objs");
  }